

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

BlockDataPtr
vkt::ssbo::anon_unknown_15::getBlockDataPtr
          (BufferLayout *layout,BlockLayoutEntry *blockLayout,void *ptr,int bufferSize)

{
  int iVar1;
  bool bVar2;
  int local_4c;
  int lastArraySize;
  int lastArrayStride;
  int baseSize;
  bool isLastUnsized;
  int bufferSize_local;
  void *ptr_local;
  BlockLayoutEntry *blockLayout_local;
  BufferLayout *layout_local;
  
  bVar2 = hasUnsizedArray(layout,blockLayout);
  iVar1 = blockLayout->size;
  if (bVar2) {
    local_4c = getUnsizedArrayStride(layout,blockLayout);
    if (local_4c == 0) {
      local_4c = 1;
    }
    BlockDataPtr::BlockDataPtr
              ((BlockDataPtr *)&layout_local,ptr,bufferSize,(bufferSize - iVar1) / local_4c);
  }
  else {
    BlockDataPtr::BlockDataPtr((BlockDataPtr *)&layout_local,ptr,bufferSize,0);
  }
  return _layout_local;
}

Assistant:

BlockDataPtr getBlockDataPtr (const BufferLayout& layout, const BlockLayoutEntry& blockLayout, void* ptr, int bufferSize)
{
	const bool	isLastUnsized	= hasUnsizedArray(layout, blockLayout);
	const int	baseSize		= blockLayout.size;

	if (isLastUnsized)
	{
		const int		lastArrayStride	= getUnsizedArrayStride(layout, blockLayout);
		const int		lastArraySize	= (bufferSize-baseSize) / (lastArrayStride ? lastArrayStride : 1);

		DE_ASSERT(baseSize + lastArraySize*lastArrayStride == bufferSize);

		return BlockDataPtr(ptr, bufferSize, lastArraySize);
	}
	else
		return BlockDataPtr(ptr, bufferSize, 0);
}